

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_factory.cpp
# Opt level: O1

unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_> __thiscall
n_e_s::core::MmuFactory::create(MmuFactory *this,MemBankList *mem_banks)

{
  pointer puVar1;
  Mmu *this_00;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer puVar2;
  pointer __p;
  _Head_base<0UL,_n_e_s::core::IMemBank_*,_false> local_38;
  _Head_base<0UL,_n_e_s::core::Mmu_*,_false> local_30;
  
  this_00 = (Mmu *)operator_new(0x20);
  (this_00->super_IMmu)._vptr_IMmu = (_func_int **)0x0;
  (this_00->mem_banks_).
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->mem_banks_).
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->mem_banks_).
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_IMmu)._vptr_IMmu = (_func_int **)&PTR__Mmu_001329d0;
  (this_00->mem_banks_).
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->mem_banks_).
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->mem_banks_).
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30._M_head_impl = (Mmu *)0x0;
  *(Mmu **)this = this_00;
  std::unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> *)&local_30);
  puVar1 = (mem_banks->
           super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (mem_banks->
                super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_38._M_head_impl =
         (puVar2->_M_t).
         super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>.
         _M_t.
         super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
         .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    (puVar2->_M_t).
    super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>._M_t.
    super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>.
    super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl = (IMemBank *)0x0;
    Mmu::add_mem_bank(this_00,(unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
                               *)&local_38);
    if (local_38._M_head_impl != (IMemBank *)0x0) {
      (*(local_38._M_head_impl)->_vptr_IMemBank[1])();
    }
  }
  return (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<IMmu> MmuFactory::create(MemBankList mem_banks) {
    std::unique_ptr<IMmu> immu = std::make_unique<Mmu>();
    auto mmu = static_cast<Mmu *>(immu.get());

    for (std::unique_ptr<IMemBank> &mem_bank : mem_banks) {
        mmu->add_mem_bank(std::move(mem_bank));
    }

    return immu;
}